

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

UnknownFieldSet * __thiscall
google::protobuf::internal::GeneratedMessageReflection::GetUnknownFields
          (GeneratedMessageReflection *this,Message *message)

{
  ulong uVar1;
  
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    GoogleOnceInit(&(anonymous_namespace)::empty_unknown_field_set_once_,
                   anon_unknown_0::InitEmptyUnknownFieldSet);
    return (anonymous_namespace)::empty_unknown_field_set_;
  }
  uVar1 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                    (ulong)(uint)(this->schema_).metadata_offset_);
  if ((uVar1 & 1) != 0) {
    return (UnknownFieldSet *)(uVar1 & 0xfffffffffffffffe);
  }
  GoogleOnceInit(&protobuf::(anonymous_namespace)::default_unknown_field_set_once_init_,
                 protobuf::anon_unknown_0::InitDefaultUnknownFieldSet);
  return protobuf::(anonymous_namespace)::default_unknown_field_set_instance_;
}

Assistant:

const UnknownFieldSet& GeneratedMessageReflection::GetUnknownFields(
    const Message& message) const {
  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // We have to ensure that any mutations made to the return value of
    // MutableUnknownFields() are not reflected here.
    return GetEmptyUnknownFieldSet();
  } else {
    return GetInternalMetadataWithArena(message).unknown_fields();
  }
}